

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::EnumValueShortName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumValueDescriptor *descriptor)

{
  EnumValueDescriptor *descriptor_00;
  string long_name;
  string long_name_prefix;
  string class_name;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  EnumName_abi_cxx11_(&local_38,*(objectivec **)(this + 0x18),(EnumDescriptor *)descriptor);
  std::operator+(&local_58,&local_38,"_");
  EnumValueName_abi_cxx11_(&sStack_78,this,descriptor_00);
  StripPrefixString(__return_storage_ptr__,&sStack_78,&local_58);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string EnumValueShortName(const EnumValueDescriptor* descriptor) {
  // Enum value names (EnumValueName above) are the enum name turned into
  // a class name and then the value name is CamelCased and concatenated; the
  // whole thing then gets sanitized for reserved words.
  // The "short name" is intended to be the final leaf, the value name; but
  // you can't simply send that off to sanitize as that could result in it
  // getting modified when the full name didn't.  For example enum
  // "StorageModes" has a value "retain".  So the full name is
  // "StorageModes_Retain", but if we sanitize "retain" it would become
  // "RetainValue".
  // So the right way to get the short name is to take the full enum name
  // and then strip off the enum name (leaving the value name and anything
  // done by sanitize).
  const string class_name = EnumName(descriptor->type());
  const string long_name_prefix = class_name + "_";
  const string long_name = EnumValueName(descriptor);
  return StripPrefixString(long_name, long_name_prefix);
}